

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

GCtab * lj_lib_checktabornil(lua_State *L,int narg)

{
  ulong uVar1;
  
  if (L->base + (long)narg + -1 < L->top) {
    uVar1 = L->base[(long)narg + -1].u64;
    if ((uint)(uVar1 >> 0x2f) == 0x1fff4) {
      return (GCtab *)(uVar1 & 0x7fffffffffff);
    }
    if (uVar1 == 0xffffffffffffffff) {
      return (GCtab *)0x0;
    }
  }
  lj_err_arg(L,narg,LJ_ERR_NOTABN);
}

Assistant:

GCtab *lj_lib_checktabornil(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (tvistab(o))
      return tabV(o);
    else if (tvisnil(o))
      return NULL;
  }
  lj_err_arg(L, narg, LJ_ERR_NOTABN);
  return NULL;  /* unreachable */
}